

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_write_ppc64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  CPUPPCState_conflict1 *env;
  
  if (regid - 2 < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 2) * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x2a < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x12b28) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x22 < 8) {
    if (3 < *size) {
      *size = 4;
      *(uint *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x210) = *value & 0xf;
      return UC_ERR_OK;
    }
  }
  else {
    switch(regid) {
    case 0x4a:
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x200) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4b:
      if (3 < *size) {
        *size = 4;
        *(ulong *)((long)_env + 0x238) = (ulong)*value;
        return UC_ERR_OK;
      }
      break;
    case 0x4c:
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x208) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4d:
      if (7 < *size) {
        *size = 8;
        uVar9 = *(ulong *)((long)_env + 0x12f70) & *value;
        uVar5 = (uint)*(ulong *)((long)_env + 0x280);
        if (((*(byte *)((long)_env + 0x12f88) & 4) != 0) &&
           ((((uint)uVar9 ^ uVar5) >> 0x11 & 1) != 0)) {
          uVar1 = *_env;
          uVar2 = *(undefined8 *)((long)_env + 8);
          uVar3 = *(undefined8 *)((long)_env + 0x10);
          uVar4 = *(undefined8 *)((long)_env + 0x18);
          *(undefined8 *)_env = *(undefined8 *)((long)_env + 0x288);
          *(undefined8 *)((long)_env + 8) = *(undefined8 *)((long)_env + 0x290);
          *(undefined8 *)((long)_env + 0x288) = uVar1;
          *(undefined8 *)((long)_env + 0x290) = uVar2;
          *(undefined8 *)((long)_env + 0x10) = *(undefined8 *)((long)_env + 0x298);
          *(undefined8 *)((long)_env + 0x18) = *(undefined8 *)((long)_env + 0x2a0);
          *(undefined8 *)((long)_env + 0x298) = uVar3;
          *(undefined8 *)((long)_env + 0x2a0) = uVar4;
        }
        uVar8 = uVar9 & 0xefffffffffffffff | *(ulong *)((long)_env + 0x280) & 0x1000000000000000;
        uVar6 = (ulong)((uint)(uVar9 >> 6) & 1);
        if (uVar6 != ((uVar5 >> 6 & 1) != 0)) {
          *(ulong *)((long)_env + 0x132e8) = uVar6 * 0xfff00000;
        }
        uVar6 = uVar8 | 0x8030;
        if (((uint)uVar9 >> 0xe & 1) == 0) {
          uVar6 = uVar8;
        }
        if ((*(ulong *)((long)_env + 0x12f90) >> 0x2d & 1) == 0) {
          uVar6 = uVar8;
        }
        *(ulong *)((long)_env + 0x280) = uVar6;
        uVar7 = (uint)(((uint)uVar6 >> 0xe & 1) == 0);
        uVar5 = (uint)(uVar6 >> 4) & 2 | uVar7;
        if ((*(byte *)((long)_env + 0x12f78) & 8) == 0) {
          uVar5 = uVar5 ^ 2;
          uVar7 = ((uint)(uVar6 >> 3) & 2 | uVar7) ^ 2;
          uVar10 = (uint)(uVar6 >> 0x3a);
        }
        else {
          uVar7 = (uint)(uVar6 >> 3) & 2 | uVar7;
          uVar10 = (uint)(uVar6 >> 0x1a) & 0x3f;
        }
        *(uint *)((long)_env + 0x13328) = uVar5 | uVar10 & 4;
        *(uint *)((long)_env + 0x1332c) = uVar10 & 4 | uVar7;
        *(ulong *)((long)_env + 0x13318) =
             uVar6 & 0x9000000082c06631 | *(ulong *)((long)_env + 0x13320);
        return UC_ERR_OK;
      }
      break;
    case 0x4e:
      if (3 < *size) {
        *size = 4;
        store_fpscr((CPUPPCState_conflict *)_env,(ulong)*value,0xffffffff);
        return UC_ERR_OK;
      }
      break;
    case 0x4f:
      if (3 < *size) {
        *size = 4;
        uVar5 = *value;
        for (uVar7 = 7; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
          *(uint *)((long)_env + (ulong)uVar7 * 4 + 0x210) = uVar5 & 0xf;
          uVar5 = uVar5 >> 4;
        }
        return UC_ERR_OK;
      }
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x2a8) = *value;
        *setpc = 1;
        return UC_ERR_OK;
      }
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        env->gpr[regid - UC_PPC_REG_0] = *(ppcreg_t *)value;
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0) = *(uint64_t *)value;
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        env->crf[regid - UC_PPC_REG_CR0] = (*(uint32_t *)value) & 0b1111;
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            env->nip = *(ppcreg_t *)value;
            *setpc = 1;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = *(uint32_t *)value;
            for (i = 7; i >= 0; i--) {
                env->crf[i] = val & 0b1111;
                val >>= 4;
            }
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            env->lr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            env->ctr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            uc_ppc_store_msr(env, *(ppcreg_t *)value, 0);
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            env->xer = *(uint32_t *)value;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            store_fpscr(env, *(uint32_t *)value, 0xffffffff);
            break;
        }
    }

    return ret;
}